

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaUtils.cpp
# Opt level: O0

bool nv::cuda::isValidDevice(int i)

{
  int i_local;
  
  return false;
}

Assistant:

bool nv::cuda::isValidDevice(int i)
{
#if defined HAVE_CUDA

	cudaDeviceProp device_properties;
	cudaGetDeviceProperties(&device_properties, i);
	int gflops = device_properties.multiProcessorCount * device_properties.clockRate;

	if (device_properties.major == -1 || device_properties.minor == -1) {
		// Emulation device.
		return false;
	}

#if CUDART_VERSION >= 2030 // 2.3
	/*if (device_properties.integrated)
	{
		// Integrated devices.
		return false;
	}*/
#endif

	return true;
#else
	return false;
#endif
}